

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int hd_inflate_commit_newname(nghttp2_hd_inflater *inflater,nghttp2_hd_nv *nv_out)

{
  nghttp2_rcbuf *pnVar1;
  nghttp2_rcbuf *pnVar2;
  int iVar3;
  nghttp2_hd_nv nv;
  nghttp2_hd_nv local_38;
  
  local_38.flags = inflater->no_index != '\0';
  pnVar1 = inflater->namercbuf;
  pnVar2 = inflater->valuercbuf;
  local_38.name = pnVar1;
  local_38.value = pnVar2;
  local_38.token = lookup_token(pnVar1->base,pnVar1->len);
  if ((inflater->index_required != '\0') &&
     (iVar3 = add_hd_table_incremental(&inflater->ctx,&local_38,(nghttp2_hd_map *)0x0,0), iVar3 != 0
     )) {
    return iVar3;
  }
  nv_out->token = local_38.token;
  nv_out->flags = local_38.flags;
  *(int3 *)&nv_out->field_0x15 = local_38._21_3_;
  nv_out->name = local_38.name;
  nv_out->value = local_38.value;
  inflater->nv_name_keep = pnVar1;
  inflater->nv_value_keep = pnVar2;
  inflater->namercbuf = (nghttp2_rcbuf *)0x0;
  inflater->valuercbuf = (nghttp2_rcbuf *)0x0;
  return 0;
}

Assistant:

static int hd_inflate_commit_newname(nghttp2_hd_inflater *inflater,
                                     nghttp2_hd_nv *nv_out) {
  nghttp2_hd_nv nv;
  int rv;

  if (inflater->no_index) {
    nv.flags = NGHTTP2_NV_FLAG_NO_INDEX;
  } else {
    nv.flags = NGHTTP2_NV_FLAG_NONE;
  }

  nv.name = inflater->namercbuf;
  nv.value = inflater->valuercbuf;
  nv.token = lookup_token(inflater->namercbuf->base, inflater->namercbuf->len);

  if (inflater->index_required) {
    rv = add_hd_table_incremental(&inflater->ctx, &nv, NULL, 0);

    if (rv != 0) {
      return rv;
    }
  }

  emit_header(nv_out, &nv);

  inflater->nv_name_keep = nv.name;
  inflater->nv_value_keep = nv.value;

  inflater->namercbuf = NULL;
  inflater->valuercbuf = NULL;

  return 0;
}